

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyHexStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  int iVar1;
  char *pcVar2;
  sxi32 sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  long local_48;
  sxi64 nVal;
  int isNeg;
  char *zEnd;
  char *zIn;
  char **zRest_local;
  void *pOutVal_local;
  char *pcStack_10;
  sxu32 nLen_local;
  char *zSrc_local;
  
  bVar8 = false;
  local_48 = 0;
  pcVar4 = zSrc + nLen;
  pcStack_10 = zSrc;
  while( true ) {
    bVar7 = false;
    if (pcStack_10 < pcVar4) {
      ppuVar5 = __ctype_b_loc();
      bVar7 = ((*ppuVar5)[(int)*pcStack_10] & 0x2000) != 0;
    }
    if (!bVar7) break;
    pcStack_10 = pcStack_10 + 1;
  }
  if ((pcStack_10 < pcVar4) && ((*pcStack_10 == '-' || (*pcStack_10 == '+')))) {
    bVar8 = *pcStack_10 == '-';
    pcStack_10 = pcStack_10 + 1;
  }
  if (((pcStack_10 < pcVar4 + -2) && (*pcStack_10 == '0')) &&
     ((pcStack_10[1] == 'x' || (pcStack_10[1] == 'X')))) {
    pcStack_10 = pcStack_10 + 2;
  }
  while( true ) {
    pcVar2 = pcStack_10;
    bVar7 = false;
    if (pcStack_10 < pcVar4) {
      bVar7 = *pcStack_10 == '0';
    }
    if (!bVar7) break;
    pcStack_10 = pcStack_10 + 1;
  }
  for (; ((pcVar6 = pcStack_10, pcStack_10 < pcVar4 &&
          (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*pcStack_10] & 0x1000) != 0)) &&
         (iVar1 = (int)pcVar2, (int)pcStack_10 - iVar1 < 0x10)); pcStack_10 = pcStack_10 + 4) {
    sVar3 = SyHexToint((int)*pcStack_10);
    local_48 = local_48 * 0x10 + (long)sVar3;
    pcVar6 = pcStack_10 + 1;
    if (((pcVar4 <= pcVar6) || (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*pcVar6] & 0x1000) == 0)
        ) || (0xf < (int)pcVar6 - iVar1)) break;
    sVar3 = SyHexToint((int)*pcVar6);
    local_48 = local_48 * 0x10 + (long)sVar3;
    pcVar6 = pcStack_10 + 2;
    if (((pcVar4 <= pcVar6) || (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*pcVar6] & 0x1000) == 0)
        ) || (0xf < (int)pcVar6 - iVar1)) break;
    sVar3 = SyHexToint((int)*pcVar6);
    local_48 = local_48 * 0x10 + (long)sVar3;
    pcVar6 = pcStack_10 + 3;
    if (((pcVar4 <= pcVar6) || (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*pcVar6] & 0x1000) == 0)
        ) || (0xf < (int)pcVar6 - iVar1)) break;
    sVar3 = SyHexToint((int)*pcVar6);
    local_48 = local_48 * 0x10 + (long)sVar3;
  }
  while( true ) {
    pcStack_10 = pcVar6;
    bVar7 = false;
    if (pcStack_10 < pcVar4) {
      ppuVar5 = __ctype_b_loc();
      bVar7 = ((*ppuVar5)[(int)*pcStack_10] & 0x2000) != 0;
    }
    if (!bVar7) break;
    pcVar6 = pcStack_10 + 1;
  }
  if (zRest != (char **)0x0) {
    *zRest = pcStack_10;
  }
  if (pOutVal != (void *)0x0) {
    if ((bVar8) && (local_48 != 0)) {
      local_48 = -local_48;
    }
    *(long *)pOutVal = local_48;
  }
  sVar3 = -0xc;
  if (pcVar4 <= pcStack_10) {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 SyHexStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( *zSrc == '-' || *zSrc == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	if( zSrc < &zEnd[-2] && zSrc[0] == '0' && (zSrc[1] == 'x' || zSrc[1] == 'X') ){
		/* Bypass hex prefix */
		zSrc += sizeof(char) * 2;
	}	
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++;
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
		if(zSrc >= zEnd || !SyisHex(zSrc[0]) || (int)(zSrc-zIn) > 15) break; nVal = nVal * 16 + SyHexToint(zSrc[0]);  zSrc++ ;
	}
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}	
	if( zRest ){
		*zRest = zSrc;
	}
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return zSrc >= zEnd ? SXRET_OK : SXERR_SYNTAX;
}